

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O2

void __thiscall
aggreports::WheatsheafAndWheatsheafMean
          (aggreports *this,vector<int,_std::allocator<int>_> *handles,
          offset_in_OutLosses_to_subr GetOutLoss,int epcalc,int eptype,int eptype_tvar,
          int ensemble_id)

{
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *this_00;
  _Rb_tree_header *this_01;
  _Rb_tree_color _Var1;
  pointer pmVar2;
  _Rb_tree_color *p_Var3;
  pointer pfVar4;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar5;
  aggreports *this_02;
  pointer piVar6;
  pointer piVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  mapped_type *pmVar10;
  code *pcVar11;
  _Base_ptr p_Var12;
  bool *pbVar13;
  mapped_type_conflict2 *pmVar14;
  mapped_type *pmVar15;
  undefined4 in_register_0000000c;
  int *piVar16;
  _Rb_tree_color *p_Var17;
  long *plVar18;
  long lVar19;
  OASIS_FLOAT OVar20;
  outkey2 oVar21;
  int in_stack_00000010;
  allocator_type local_131;
  aggreports *local_130;
  int local_124;
  vector<int,_std::allocator<int>_> *local_120;
  _Base_ptr local_118;
  int local_110;
  value_type_conflict3 local_10c;
  vector<int,_std::allocator<int>_> fileIDs;
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  maxCount;
  int local_b8;
  reverse_iterator<__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>_>
  local_a0;
  reverse_iterator<__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>_>
  local_98;
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  mean_map;
  map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
  items;
  
  items._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &items._M_t._M_impl.super__Rb_tree_header._M_header;
  items._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  items._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  items._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       items._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_130 = this;
  local_124 = eptype_tvar;
  local_120 = handles;
  local_110 = eptype;
  if (in_stack_00000010 == 0) {
    local_b8 = this->samplesize_;
    pmVar2 = (this->out_loss_->
             super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    plVar18 = (long *)(&maxCount._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4 +
                      CONCAT44(in_register_0000000c,epcalc));
    for (p_Var12 = *(_Base_ptr *)((long)&pmVar2[1]._M_t._M_impl.super__Rb_tree_header + 0x10);
        this = local_130, p_Var12 != &pmVar2[1]._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
      maxCount._M_t._M_impl._0_4_ = p_Var12[1]._M_color;
      maxCount._M_t._M_impl._4_4_ = *(undefined4 *)&p_Var12[1].field_0x4;
      maxCount._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           *(_Rb_tree_color *)&p_Var12[1]._M_parent;
      oVar21 = *(outkey2 *)(p_Var12 + 1);
      maxCount._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
           *(undefined4 *)((long)&p_Var12[1]._M_parent + 4);
      maxCount._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)
           CONCAT44(maxCount._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_,
                    *(undefined4 *)&p_Var12[1]._M_left);
      pcVar11 = (code *)GetOutLoss;
      if ((GetOutLoss & 1) != 0) {
        pcVar11 = *(code **)(*plVar18 + -1 + GetOutLoss);
      }
      OVar20 = (OASIS_FLOAT)(*pcVar11)(plVar18);
      FillWheatsheafItems(local_130,oVar21,&items,OVar20);
    }
  }
  else {
    this_00 = &this->ensembletosidx_;
    pmVar10 = std::
              map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](this_00,&stack0x00000010);
    local_b8 = (int)((ulong)((long)(pmVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(pmVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start) >> 2);
    pmVar2 = (this->out_loss_->
             super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    plVar18 = (long *)(&maxCount._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4 +
                      CONCAT44(in_register_0000000c,epcalc));
    p_Var12 = *(_Base_ptr *)((long)&pmVar2[1]._M_t._M_impl.super__Rb_tree_header + 0x10);
    while (p_Var12 != &pmVar2[1]._M_t._M_impl.super__Rb_tree_header._M_header) {
      maxCount._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)
           CONCAT44(maxCount._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_,
                    *(undefined4 *)&p_Var12[1]._M_left);
      maxCount._M_t._M_impl._0_4_ = SUB84(*(undefined8 *)(p_Var12 + 1),0);
      maxCount._M_t._M_impl._4_4_ = SUB84((ulong)*(undefined8 *)(p_Var12 + 1) >> 0x20,0);
      maxCount._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           (_Rb_tree_color)p_Var12[1]._M_parent;
      maxCount._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
           SUB84((ulong)p_Var12[1]._M_parent >> 0x20,0);
      local_118 = p_Var12;
      pmVar10 = std::
                map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[](this_00,&stack0x00000010);
      p_Var3 = (_Rb_tree_color *)
               (pmVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (p_Var17 = (_Rb_tree_color *)
                     (pmVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start; p_Var17 != p_Var3; p_Var17 = p_Var17 + 1) {
        _Var1 = *p_Var17;
        if (maxCount._M_t._M_impl.super__Rb_tree_header._M_header._M_color == _Var1) {
          pcVar11 = (code *)GetOutLoss;
          if ((GetOutLoss & 1) != 0) {
            pcVar11 = *(code **)(*plVar18 + -1 + GetOutLoss);
          }
          oVar21.period_no = maxCount._M_t._M_impl._4_4_;
          oVar21.summary_id = maxCount._M_t._M_impl._0_4_;
          OVar20 = (OASIS_FLOAT)(*pcVar11)(plVar18);
          oVar21.sidx = _Var1;
          FillWheatsheafItems(local_130,oVar21,&items,OVar20);
        }
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(local_118);
      this = local_130;
    }
  }
  pbVar13 = this->outputFlags_;
  piVar16 = (local_120->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pbVar13[*piVar16] == true) {
    GetFileIDs((vector<int,_std::allocator<int>_> *)&maxCount,this,*piVar16,1);
    WritePerSampleExceedanceProbabilityTable
              (this,(vector<int,_std::allocator<int>_> *)&maxCount,&items,local_124,ensemble_id);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&maxCount);
    pbVar13 = this->outputFlags_;
    piVar16 = (local_120->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (pbVar13[piVar16[1]] != false) {
    maxCount._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &maxCount._M_t._M_impl.super__Rb_tree_header._M_header;
    maxCount._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    maxCount._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    maxCount._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    this_01 = &mean_map._M_t._M_impl.super__Rb_tree_header;
    maxCount._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         maxCount._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (p_Var12 = items._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var12 != &items._M_t._M_impl.super__Rb_tree_header;
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
      std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>::pair
                ((pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_> *)&mean_map,
                 (pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_> *)(p_Var12 + 1))
      ;
      p_Var8 = mean_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      lVar19 = CONCAT44(mean_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                        mean_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
      pmVar14 = std::
                map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                ::operator[](&maxCount,(key_type *)&mean_map);
      p_Var9 = mean_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (*pmVar14 < (ulong)((long)p_Var8 - lVar19 >> 2)) {
        lVar19 = CONCAT44(mean_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                          mean_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
        pmVar14 = std::
                  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                  ::operator[](&maxCount,(key_type *)&mean_map);
        *pmVar14 = (long)p_Var9 - lVar19 >> 2;
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)this_01);
    }
    mean_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    mean_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    mean_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    psVar5 = &local_130->summaryids_;
    p_Var12 = (local_130->summaryids_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    mean_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &this_01->_M_header;
    mean_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &this_01->_M_header;
    for (; (_Rb_tree_header *)p_Var12 != &(psVar5->_M_t)._M_impl.super__Rb_tree_header;
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
      pmVar14 = std::
                map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                ::operator[](&maxCount,(key_type *)(p_Var12 + 1));
      local_10c = 0.0;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&fileIDs,*pmVar14,&local_10c,&local_131);
      pmVar15 = std::
                map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                ::operator[](&mean_map,(key_type *)(p_Var12 + 1));
      std::vector<float,_std::allocator<float>_>::_M_move_assign
                (pmVar15,(_Vector_base<float,_std::allocator<float>_> *)&fileIDs);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&fileIDs);
    }
    for (p_Var12 = items._M_t._M_impl.super__Rb_tree_header._M_header._M_left; this_02 = local_130,
        (_Rb_tree_header *)p_Var12 != &items._M_t._M_impl.super__Rb_tree_header;
        p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
      std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>::pair
                ((pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_> *)&fileIDs,
                 (pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_> *)(p_Var12 + 1))
      ;
      local_98.current._M_current =
           (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
           (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
           fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      local_a0.current._M_current =
           (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
           (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
           fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      std::
      sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>>
                (&local_98,&local_a0);
      piVar7 = fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage;
      piVar6 = fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_finish;
      for (lVar19 = 0; (pointer)((long)piVar6 + lVar19) != piVar7; lVar19 = lVar19 + 4) {
        local_118 = (_Base_ptr)CONCAT44(local_118._4_4_,*(pointer)((long)piVar6 + lVar19));
        pmVar15 = std::
                  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                  ::operator[](&mean_map,(key_type *)&fileIDs);
        pfVar4 = (pmVar15->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        *(float *)((long)pfVar4 + lVar19) = local_118._0_4_ + *(float *)((long)pfVar4 + lVar19);
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)
                 &fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish);
    }
    GetFileIDs(&fileIDs,local_130,
               (local_120->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[1],0);
    WriteExceedanceProbabilityTable
              (this_02,&fileIDs,&mean_map,(double)this_02->totalperiods_,local_110,local_124,
               ensemble_id,local_b8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&fileIDs.super__Vector_base<int,_std::allocator<int>_>);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
    ::~_Rb_tree(&mean_map._M_t);
    std::
    _Rb_tree<int,_std::pair<const_int,_unsigned_long>,_std::_Select1st<std::pair<const_int,_unsigned_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
    ::~_Rb_tree(&maxCount._M_t);
  }
  std::
  _Rb_tree<wheatkey,_std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
  ::~_Rb_tree(&items._M_t);
  return;
}

Assistant:

void aggreports::WheatsheafAndWheatsheafMean(const std::vector<int> handles,
				OASIS_FLOAT (OutLosses::*GetOutLoss)(),
				const int epcalc, const int eptype,
				const int eptype_tvar, int ensemble_id) {

  std::map<wheatkey, lossvec> items;
  int samplesize;

  if (ensemble_id != 0) {
    samplesize = (int)ensembletosidx_[ensemble_id].size();
    for (auto x : (*out_loss_)[SAMPLES]) {
      for (auto sidx : ensembletosidx_[ensemble_id]) {
	if (x.first.sidx == sidx) {
	  FillWheatsheafItems(x.first, items, (x.second.*GetOutLoss)());
	}
      }
    }
  } else {
    samplesize = samplesize_;
    for (auto x : (*out_loss_)[SAMPLES]) {
      FillWheatsheafItems(x.first, items, (x.second.*GetOutLoss)());
    }
  }

  if (outputFlags_[handles[WHEATSHEAF]] == true) {
    std::vector<int> fileIDs = GetFileIDs(handles[WHEATSHEAF], PSEPT);
    WritePerSampleExceedanceProbabilityTable(fileIDs, items, eptype,
					     eptype_tvar);
  }

  if (outputFlags_[handles[WHEATSHEAF_MEAN]] == false) return;

  std::map<int, size_t> maxCount;
  for (auto x : items) {
    if (x.second.size() > maxCount[x.first.summary_id]) {
      maxCount[x.first.summary_id] = x.second.size();
    }
  }

  std::map<int, lossvec> mean_map;
  for (std::set<int>::iterator it = summaryids_.begin();
       it != summaryids_.end(); ++it) {
    mean_map[*it] = lossvec(maxCount[*it], 0);
  }

  for (auto s : items) {
    lossvec &lpv = s.second;
    std::sort(lpv.rbegin(), lpv.rend());
    int i = 0;
    for (auto lp : lpv) {
      mean_map[s.first.summary_id][i] += lp;
      i++;
    }
  }

  std::vector<int> fileIDs = GetFileIDs(handles[WHEATSHEAF_MEAN]);
  WriteExceedanceProbabilityTable(fileIDs, mean_map, totalperiods_, epcalc,
				  eptype, eptype_tvar, samplesize);

}